

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_manager.cpp
# Opt level: O2

string * duckdb::DatabaseManager::GetDefaultDatabase_abi_cxx11_(ClientContext *context)

{
  bool bVar1;
  type pCVar2;
  pointer this;
  CatalogSearchEntry *str;
  DatabaseManager *pDVar3;
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  pCVar2 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::operator*
                     (&context->client_data);
  this = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
         ::operator->(&pCVar2->catalog_search_path);
  str = CatalogSearchPath::GetDefault(this);
  bVar1 = IsInvalidCatalog((string *)str);
  if (bVar1) {
    pDVar3 = Get(context);
    if ((pDVar3->default_database)._M_string_length == 0) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,
                 "Calling DatabaseManager::GetDefaultDatabase with no default database set",
                 &local_39);
      InternalException::InternalException(this_00,&local_38);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    str = (CatalogSearchEntry *)&pDVar3->default_database;
  }
  return &str->catalog;
}

Assistant:

const string &DatabaseManager::GetDefaultDatabase(ClientContext &context) {
	auto &config = ClientData::Get(context);
	auto &default_entry = config.catalog_search_path->GetDefault();
	if (IsInvalidCatalog(default_entry.catalog)) {
		auto &result = DatabaseManager::Get(context).default_database;
		if (result.empty()) {
			throw InternalException("Calling DatabaseManager::GetDefaultDatabase with no default database set");
		}
		return result;
	}
	return default_entry.catalog;
}